

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testExtendByInterval<short>(char *type)

{
  short sVar1;
  ostream *poVar2;
  short *psVar3;
  char *in_RDI;
  bool bVar4;
  float fVar5;
  short p1_1;
  short p0_1;
  uint i;
  short max;
  short min;
  Interval<short> b_1;
  uint iters;
  Rand32 rand;
  Interval<short> b1;
  Interval<short> b0;
  short p1;
  short p0;
  Interval<short> b;
  float in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  Rand32 *in_stack_ffffffffffffffa0;
  Rand32 *this;
  Interval<short> local_48;
  short local_44;
  short local_42;
  uint local_40;
  short local_3c;
  short local_3a;
  Interval<short> local_38;
  undefined4 local_34;
  Rand32 local_30;
  Interval<short> local_24;
  Interval<short> local_20;
  Interval<short> local_1c;
  Interval<short> local_18;
  short local_14;
  short local_12;
  Interval<short> local_10;
  Interval<short> local_c;
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"    extendBy() interval for type ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Interval<short>::Interval((Interval<short> *)0x16c8a2);
  Imath_3_2::Interval<short>::Interval((Interval<short> *)0x16c8ac);
  Imath_3_2::Interval<short>::extendBy(&local_c,&local_10);
  sVar1 = std::numeric_limits<short>::max();
  bVar4 = false;
  if (local_c.min == sVar1) {
    sVar1 = std::numeric_limits<short>::lowest();
    bVar4 = local_c.max == sVar1;
  }
  if (!bVar4) {
    __assert_fail("b.min == T (std::numeric_limits<T>::max ()) && b.max == T (std::numeric_limits<T>::lowest ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0xde,"void (anonymous namespace)::testExtendByInterval(const char *) [T = short]"
                 );
  }
  local_12 = -1;
  local_14 = 1;
  Imath_3_2::Interval<short>::Interval((Interval<short> *)0x16c93e);
  Imath_3_2::Interval<short>::Interval(&local_1c,&local_12,&local_14);
  Imath_3_2::Interval<short>::extendBy(&local_18,&local_1c);
  if (local_18.min != local_12 || local_18.max != local_14) {
    __assert_fail("b0.min == p0 && b0.max == p1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0xea,"void (anonymous namespace)::testExtendByInterval(const char *) [T = short]"
                 );
  }
  Imath_3_2::Interval<short>::Interval(&local_20,&local_12,&local_14);
  Imath_3_2::Interval<short>::Interval((Interval<short> *)0x16c9d1);
  Imath_3_2::Interval<short>::extendBy(&local_20,&local_24);
  if (local_20.min != local_12 || local_20.max != local_14) {
    __assert_fail("b1.min == p0 && b1.max == p1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0xee,"void (anonymous namespace)::testExtendByInterval(const char *) [T = short]"
                 );
  }
  Imath_3_2::Rand32::Rand32
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  local_34 = 10;
  Imath_3_2::Interval<short>::Interval((Interval<short> *)0x16ca52);
  local_40 = 1;
  while( true ) {
    if (9 < local_40) {
      return;
    }
    this = &local_30;
    fVar5 = Imath_3_2::Rand32::nextf(this,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    local_42 = (short)(int)fVar5;
    fVar5 = Imath_3_2::Rand32::nextf(this,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    local_44 = (short)(int)fVar5;
    local_3a = local_38.min;
    local_3c = local_38.max;
    psVar3 = std::min<short>(&local_3a,&local_42);
    local_3a = *psVar3;
    psVar3 = std::max<short>(&local_3c,&local_44);
    local_3c = *psVar3;
    Imath_3_2::Interval<short>::Interval(&local_48,&local_42,&local_44);
    Imath_3_2::Interval<short>::extendBy(&local_38,&local_48);
    if (local_38.min != local_3a || local_38.max != local_3c) break;
    local_40 = local_40 + 1;
  }
  __assert_fail("b.min == min && b.max == max",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                ,0x107,"void (anonymous namespace)::testExtendByInterval(const char *) [T = short]")
  ;
}

Assistant:

void
testExtendByInterval (const char* type)
{
    cout << "    extendBy() interval for type " << type << endl;

    //
    // Extend empty interval with an empty interval
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        b.extendBy (IMATH_INTERNAL_NAMESPACE::Interval<T> ());
        assert (
            b.min == T (std::numeric_limits<T>::max ()) &&
            b.max == T (std::numeric_limits<T>::lowest ()));
    }

    //
    // Extend empty interval with a non-empty interval and vice versa.
    //
    {
        T p0 (-1);
        T p1 (1);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b0;
        b0.extendBy (IMATH_INTERNAL_NAMESPACE::Interval<T> (p0, p1));
        assert (b0.min == p0 && b0.max == p1);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b1 (p0, p1);
        b1.extendBy (IMATH_INTERNAL_NAMESPACE::Interval<T> ());
        assert (b1.min == p0 && b1.max == p1);
    }

    //
    // Extend non-empty interval with non-empty interval. Starts with empty, then builds.
    //
    IMATH_INTERNAL_NAMESPACE::Rand32 rand (0);
    const unsigned int               iters = 10;
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;

        T min, max;

        for (unsigned int i = 1; i < iters; i++)
        {
            T p0 (static_cast<T>(rand.nextf (0, 999)));
            T p1 (static_cast<T>(rand.nextf (1000, 1999)));

            min = b.min;
            max = b.max;
            min = std::min (min, p0);
            max = std::max (max, p1);

            b.extendBy (IMATH_INTERNAL_NAMESPACE::Interval<T> (p0, p1));

            assert (b.min == min && b.max == max);
        }
    }
}